

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenBuilders(CppGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  Value *type_00;
  BaseType BVar1;
  FieldDef *pFVar2;
  pointer ppFVar3;
  Namespace *this_01;
  pointer ppFVar4;
  size_t sVar5;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  __tmp;
  ulong uVar6;
  byte bVar7;
  FieldDef **field;
  string *text;
  bool bVar8;
  allocator<char> local_659;
  string offset;
  string name;
  string type;
  string value;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  _Any_data local_4d0;
  code *local_4c0;
  code *local_4b8;
  string local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&offset,"STRUCT_NAME",(allocator<char> *)&value);
  EscapeKeyword(&name,this,(string *)struct_def);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&offset,&name);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&offset);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"struct {{STRUCT_NAME}}Builder {",(allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"  typedef {{STRUCT_NAME}} Table;",(allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  GetBuilder_abi_cxx11_(&name,this);
  std::operator+(&offset,"  ",&name);
  std::operator+(&local_1f0,&offset," &fbb_;");
  CodeWriter::operator+=(this_00,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&offset);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"  ::flatbuffers::uoffset_t start_;",(allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  bVar7 = 0;
  for (ppFVar4 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar4 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar4 = ppFVar4 + 1) {
    pFVar2 = *ppFVar4;
    if (pFVar2->deprecated == false) {
      BVar1 = (pFVar2->value).type.base_type;
      if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
        bVar8 = pFVar2->presence != kOptional;
      }
      else {
        bVar8 = false;
      }
      GenFieldOffsetName_abi_cxx11_(&offset,this,pFVar2);
      Name_abi_cxx11_(&value,this,pFVar2);
      GenUnderlyingCast(&name,this,pFVar2,false,&value);
      std::__cxx11::string::~string((string *)&value);
      if (bVar8) {
        GenDefaultConstant_abi_cxx11_(&value,this,pFVar2);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&value,"",(allocator<char> *)&type);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type,"FIELD_NAME",(allocator<char> *)&local_190);
      Name_abi_cxx11_(&local_590,this,pFVar2);
      CodeWriter::SetValue(this_00,&type,&local_590);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type,"FIELD_TYPE",(allocator<char> *)&local_190);
      type_00 = &pFVar2->value;
      GenTypeWire_abi_cxx11_(&local_590,this,&type_00->type," ",true,pFVar2->offset64);
      CodeWriter::SetValue(this_00,&type,&local_590);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::string<std::allocator<char>>((string *)&type,"ADD_OFFSET",&local_659);
      EscapeKeyword(&local_5b0,this,(string *)struct_def);
      std::operator+(&local_190,&local_5b0,"::");
      std::operator+(&local_590,&local_190,&offset);
      CodeWriter::SetValue(this_00,&type,&local_590);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type,"ADD_NAME",(allocator<char> *)&local_590);
      CodeWriter::SetValue(this_00,&type,&name);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type,"ADD_VALUE",(allocator<char> *)&local_590);
      CodeWriter::SetValue(this_00,&type,&value);
      std::__cxx11::string::~string((string *)&type);
      if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
        GenTypeWire_abi_cxx11_(&type,this,&type_00->type,"",false,pFVar2->offset64);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"ADD_FN",&local_659)
        ;
        std::operator+(&local_5b0,"AddElement<",&type);
        std::operator+(&local_190,&local_5b0,">");
        CodeWriter::SetValue(this_00,&local_590,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::__cxx11::string::~string((string *)&local_590);
      }
      else {
        if (((type_00->type).base_type == BASE_TYPE_STRUCT) &&
           (((pFVar2->value).type.struct_def)->fixed == true)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&type,"ADD_FN",(allocator<char> *)&local_190);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_590,"AddStruct",(allocator<char> *)&local_5b0);
          CodeWriter::SetValue(this_00,&type,&local_590);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&type,"ADD_FN",(allocator<char> *)&local_190);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_590,"AddOffset",(allocator<char> *)&local_5b0);
          CodeWriter::SetValue(this_00,&type,&local_590);
        }
        std::__cxx11::string::~string((string *)&local_590);
      }
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"  void add_{{FIELD_NAME}}({{FIELD_TYPE}}{{FIELD_NAME}}) {",
                 (allocator<char> *)&type);
      CodeWriter::operator+=(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"    fbb_.{{ADD_FN}}(\\",(allocator<char> *)&type);
      CodeWriter::operator+=(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar8) {
        text = &local_90;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)text,"{{ADD_OFFSET}}, {{ADD_NAME}}, {{ADD_VALUE}});",
                   (allocator<char> *)&type);
        CodeWriter::operator+=(this_00,text);
      }
      else {
        text = &local_b0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)text,"{{ADD_OFFSET}}, {{ADD_NAME}});",(allocator<char> *)&type);
        CodeWriter::operator+=(this_00,text);
      }
      std::__cxx11::string::~string((string *)text);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"  }",(allocator<char> *)&type);
      CodeWriter::operator+=(this_00,&local_d0);
      bVar7 = BVar1 == BASE_TYPE_VECTOR64 | bVar7 | BVar1 - BASE_TYPE_STRING < 2;
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&offset);
    }
  }
  GetBuilder_abi_cxx11_(&name,this);
  std::operator+(&offset,"  explicit {{STRUCT_NAME}}Builder(",&name);
  std::operator+(&local_230,&offset," &_fbb)");
  CodeWriter::operator+=(this_00,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&offset);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"        : fbb_(_fbb) {",(allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"    start_ = fbb_.StartTable();",(allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"  }",(allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"  ::flatbuffers::Offset<{{STRUCT_NAME}}> Finish() {",
             (allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"    const auto end = fbb_.EndTable(start_);",
             (allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"    auto o = ::flatbuffers::Offset<{{STRUCT_NAME}}>(end);",
             (allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  ppFVar3 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar4 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar4 != ppFVar3;
      ppFVar4 = ppFVar4 + 1) {
    if (((*ppFVar4)->deprecated == false) && ((*ppFVar4)->presence == kRequired)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&offset,"FIELD_NAME",(allocator<char> *)&value);
      Name_abi_cxx11_(&name,this,*ppFVar4);
      CodeWriter::SetValue(this_00,&offset,&name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&offset);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&offset,"OFFSET_NAME",(allocator<char> *)&value);
      GenFieldOffsetName_abi_cxx11_(&name,this,*ppFVar4);
      CodeWriter::SetValue(this_00,&offset,&name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&offset);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"    fbb_.Required(o, {{STRUCT_NAME}}::{{OFFSET_NAME}});",
                 (allocator<char> *)&offset);
      CodeWriter::operator+=(this_00,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"    return o;",(allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"  }",(allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"};",(allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"",(allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,
             "inline ::flatbuffers::Offset<{{STRUCT_NAME}}> Create{{STRUCT_NAME}}(",
             (allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  GetBuilder_abi_cxx11_(&name,this);
  std::operator+(&offset,"    ",&name);
  std::operator+(&local_3b0,&offset," &_fbb\\");
  CodeWriter::operator+=(this_00,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&offset);
  std::__cxx11::string::~string((string *)&name);
  ppFVar3 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar4 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar4 != ppFVar3;
      ppFVar4 = ppFVar4 + 1) {
    if ((*ppFVar4)->deprecated == false) {
      GenParam(this,*ppFVar4,false,",\n    ");
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,") {",(allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"  {{STRUCT_NAME}}Builder builder_(_fbb);",
             (allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  uVar6 = 1;
  if (struct_def->sortbysize != false) {
    uVar6 = 8;
  }
  for (; uVar6 != 0; uVar6 = uVar6 >> 1) {
    ppFVar4 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    while (ppFVar4 !=
           (struct_def->fields).vec.
           super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
           _M_impl.super__Vector_impl_data._M_start) {
      pFVar2 = ppFVar4[-1];
      ppFVar4 = ppFVar4 + -1;
      if ((pFVar2->deprecated == false) &&
         ((struct_def->sortbysize != true ||
          (sVar5 = SizeOf((pFVar2->value).type.base_type), uVar6 == sVar5)))) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&offset,"FIELD_NAME",(allocator<char> *)&value);
        Name_abi_cxx11_(&name,this,pFVar2);
        CodeWriter::SetValue(this_00,&offset,&name);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::~string((string *)&offset);
        if (((pFVar2->value).type.base_type - BASE_TYPE_UTYPE < 0xc) &&
           (pFVar2->presence == kOptional)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,
                     "  if({{FIELD_NAME}}) { builder_.add_{{FIELD_NAME}}(*{{FIELD_NAME}}); }",
                     (allocator<char> *)&offset);
          CodeWriter::operator+=(this_00,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_130,"  builder_.add_{{FIELD_NAME}}({{FIELD_NAME}});",
                     (allocator<char> *)&offset);
          CodeWriter::operator+=(this_00,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
        }
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"  return builder_.Finish();",(allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"}",(allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"",(allocator<char> *)&offset);
  CodeWriter::operator+=(this_00,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  if (1 < *(int *)&(this->opts_).super_IDLOptions.field_0x30c) {
    GenTraitsStruct(this,struct_def);
  }
  if ((bVar7 & (this->opts_).super_IDLOptions.cpp_direct_copy) == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,
               "inline ::flatbuffers::Offset<{{STRUCT_NAME}}> Create{{STRUCT_NAME}}Direct(",
               (allocator<char> *)&offset);
    CodeWriter::operator+=(this_00,&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    GetBuilder_abi_cxx11_(&name,this);
    std::operator+(&offset,"    ",&name);
    std::operator+(&local_490,&offset," &_fbb\\");
    CodeWriter::operator+=(this_00,&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&offset);
    std::__cxx11::string::~string((string *)&name);
    ppFVar3 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar4 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppFVar4 != ppFVar3;
        ppFVar4 = ppFVar4 + 1) {
      if ((*ppFVar4)->deprecated == false) {
        GenParam(this,*ppFVar4,true,",\n    ");
      }
    }
    this_01 = (struct_def->super_Definition).defined_namespace;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"Create",(allocator<char> *)&value);
    Namespace::GetFullyQualifiedName(&offset,this_01,&name,1000);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"CREATE_NAME",(allocator<char> *)&type);
    TranslateNameSpace(&value,&offset);
    CodeWriter::SetValue(this_00,&name,&value);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b0,") {",(allocator<char> *)&name);
    CodeWriter::operator+=(this_00,&local_4b0);
    std::__cxx11::string::~string((string *)&local_4b0);
    local_4d0._8_8_ = 0;
    local_4b8 = std::
                _Function_handler<void_(const_flatbuffers::FieldDef_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp:3111:47)>
                ::_M_invoke;
    local_4c0 = std::
                _Function_handler<void_(const_flatbuffers::FieldDef_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp:3111:47)>
                ::_M_manager;
    ppFVar3 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_4d0._M_unused._M_object = this;
    for (ppFVar4 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppFVar4 != ppFVar3;
        ppFVar4 = ppFVar4 + 1) {
      if ((*ppFVar4)->offset64 == true) {
        std::function<void_(const_flatbuffers::FieldDef_*)>::operator()
                  ((function<void_(const_flatbuffers::FieldDef_*)> *)&local_4d0,*ppFVar4);
      }
    }
    ppFVar3 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar4 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppFVar4 != ppFVar3;
        ppFVar4 = ppFVar4 + 1) {
      if ((*ppFVar4)->offset64 == false) {
        std::function<void_(const_flatbuffers::FieldDef_*)>::operator()
                  ((function<void_(const_flatbuffers::FieldDef_*)> *)&local_4d0,*ppFVar4);
      }
    }
    std::_Function_base::~_Function_base((_Function_base *)&local_4d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f0,"  return {{CREATE_NAME}}{{STRUCT_NAME}}(",
               (allocator<char> *)&name);
    CodeWriter::operator+=(this_00,&local_4f0);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_510,"      _fbb\\",(allocator<char> *)&name);
    CodeWriter::operator+=(this_00,&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    ppFVar3 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar4 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppFVar4 != ppFVar3;
        ppFVar4 = ppFVar4 + 1) {
      if ((*ppFVar4)->deprecated == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,"FIELD_NAME",(allocator<char> *)&type);
        Name_abi_cxx11_(&value,this,*ppFVar4);
        CodeWriter::SetValue(this_00,&name,&value);
        std::__cxx11::string::~string((string *)&value);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,",\n      {{FIELD_NAME}}\\",(allocator<char> *)&name);
        CodeWriter::operator+=(this_00,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        BVar1 = ((*ppFVar4)->value).type.base_type;
        if ((BVar1 < (BASE_TYPE_VECTOR64|BASE_TYPE_UTYPE)) &&
           ((0x46000U >> (BVar1 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) != 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_170,"__\\",(allocator<char> *)&name);
          CodeWriter::operator+=(this_00,&local_170);
          std::__cxx11::string::~string((string *)&local_170);
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_530,");",(allocator<char> *)&name);
    CodeWriter::operator+=(this_00,&local_530);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_550,"}",(allocator<char> *)&name);
    CodeWriter::operator+=(this_00,&local_550);
    std::__cxx11::string::~string((string *)&local_550);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_570,"",(allocator<char> *)&name);
    CodeWriter::operator+=(this_00,&local_570);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::string::~string((string *)&offset);
  }
  return;
}

Assistant:

void GenBuilders(const StructDef &struct_def) {
    code_.SetValue("STRUCT_NAME", Name(struct_def));

    // Generate a builder struct:
    code_ += "struct {{STRUCT_NAME}}Builder {";
    code_ += "  typedef {{STRUCT_NAME}} Table;";
    code_ += "  " + GetBuilder() + " &fbb_;";
    code_ += "  ::flatbuffers::uoffset_t start_;";

    bool has_string_or_vector_fields = false;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const bool is_scalar = IsScalar(field.value.type.base_type);
      const bool is_default_scalar = is_scalar && !field.IsScalarOptional();
      const bool is_string = IsString(field.value.type);
      const bool is_vector = IsVector(field.value.type);
      if (is_string || is_vector) { has_string_or_vector_fields = true; }

      std::string offset = GenFieldOffsetName(field);
      std::string name = GenUnderlyingCast(field, false, Name(field));
      std::string value = is_default_scalar ? GenDefaultConstant(field) : "";

      // Generate accessor functions of the form:
      // void add_name(type name) {
      //   fbb_.AddElement<type>(offset, name, default);
      // }
      code_.SetValue("FIELD_NAME", Name(field));
      code_.SetValue("FIELD_TYPE",
                     GenTypeWire(field.value.type, " ", true, field.offset64));
      code_.SetValue("ADD_OFFSET", Name(struct_def) + "::" + offset);
      code_.SetValue("ADD_NAME", name);
      code_.SetValue("ADD_VALUE", value);
      if (is_scalar) {
        const auto type =
            GenTypeWire(field.value.type, "", false, field.offset64);
        code_.SetValue("ADD_FN", "AddElement<" + type + ">");
      } else if (IsStruct(field.value.type)) {
        code_.SetValue("ADD_FN", "AddStruct");
      } else {
        code_.SetValue("ADD_FN", "AddOffset");
      }

      code_ += "  void add_{{FIELD_NAME}}({{FIELD_TYPE}}{{FIELD_NAME}}) {";
      code_ += "    fbb_.{{ADD_FN}}(\\";
      if (is_default_scalar) {
        code_ += "{{ADD_OFFSET}}, {{ADD_NAME}}, {{ADD_VALUE}});";
      } else {
        code_ += "{{ADD_OFFSET}}, {{ADD_NAME}});";
      }
      code_ += "  }";
    }

    // Builder constructor
    code_ += "  explicit {{STRUCT_NAME}}Builder(" + GetBuilder() +
             " "
             "&_fbb)";
    code_ += "        : fbb_(_fbb) {";
    code_ += "    start_ = fbb_.StartTable();";
    code_ += "  }";

    // Finish() function.
    code_ += "  ::flatbuffers::Offset<{{STRUCT_NAME}}> Finish() {";
    code_ += "    const auto end = fbb_.EndTable(start_);";
    code_ += "    auto o = ::flatbuffers::Offset<{{STRUCT_NAME}}>(end);";

    for (const auto &field : struct_def.fields.vec) {
      if (!field->deprecated && field->IsRequired()) {
        code_.SetValue("FIELD_NAME", Name(*field));
        code_.SetValue("OFFSET_NAME", GenFieldOffsetName(*field));
        code_ += "    fbb_.Required(o, {{STRUCT_NAME}}::{{OFFSET_NAME}});";
      }
    }
    code_ += "    return o;";
    code_ += "  }";
    code_ += "};";
    code_ += "";

    // Generate a convenient CreateX function that uses the above builder
    // to create a table in one go.
    code_ +=
        "inline ::flatbuffers::Offset<{{STRUCT_NAME}}> "
        "Create{{STRUCT_NAME}}(";
    code_ += "    " + GetBuilder() + " &_fbb\\";
    for (const auto &field : struct_def.fields.vec) {
      if (!field->deprecated) { GenParam(*field, false, ",\n    "); }
    }
    code_ += ") {";

    code_ += "  {{STRUCT_NAME}}Builder builder_(_fbb);";
    for (size_t size = struct_def.sortbysize ? sizeof(largest_scalar_t) : 1;
         size; size /= 2) {
      for (auto it = struct_def.fields.vec.rbegin();
           it != struct_def.fields.vec.rend(); ++it) {
        const auto &field = **it;
        if (!field.deprecated && (!struct_def.sortbysize ||
                                  size == SizeOf(field.value.type.base_type))) {
          code_.SetValue("FIELD_NAME", Name(field));
          if (field.IsScalarOptional()) {
            code_ +=
                "  if({{FIELD_NAME}}) { "
                "builder_.add_{{FIELD_NAME}}(*{{FIELD_NAME}}); }";
          } else {
            code_ += "  builder_.add_{{FIELD_NAME}}({{FIELD_NAME}});";
          }
        }
      }
    }
    code_ += "  return builder_.Finish();";
    code_ += "}";
    code_ += "";

    // Definition for type traits for this table type. This allows querying var-
    // ious compile-time traits of the table.
    if (opts_.g_cpp_std >= cpp::CPP_STD_17) { GenTraitsStruct(struct_def); }

    // Generate a CreateXDirect function with vector types as parameters
    if (opts_.cpp_direct_copy && has_string_or_vector_fields) {
      code_ +=
          "inline ::flatbuffers::Offset<{{STRUCT_NAME}}> "
          "Create{{STRUCT_NAME}}Direct(";
      code_ += "    " + GetBuilder() + " &_fbb\\";
      for (const auto &field : struct_def.fields.vec) {
        if (!field->deprecated) { GenParam(*field, true, ",\n    "); }
      }
      // Need to call "Create" with the struct namespace.
      const auto qualified_create_name =
          struct_def.defined_namespace->GetFullyQualifiedName("Create");
      code_.SetValue("CREATE_NAME", TranslateNameSpace(qualified_create_name));
      code_ += ") {";
      // Offset64 bit fields need to be added to the buffer first, so here we
      // loop over the fields in order of their offset size, followed by their
      // definition order. Otherwise the emitted code might add a Offset
      // followed by an Offset64 which would trigger an assertion.

      // TODO(derekbailey): maybe optimize for the case where there is no
      // 64offsets in the whole schema?
      ForAllFieldsOrderedByOffset(struct_def, [&](const FieldDef *field) {
        if (field->deprecated) { return; }
        code_.SetValue("FIELD_NAME", Name(*field));
        if (IsString(field->value.type)) {
          if (!field->shared) {
            code_.SetValue(
                "CREATE_STRING",
                "CreateString" + std::string(field->offset64
                                                 ? "<::flatbuffers::Offset64>"
                                                 : ""));
          } else {
            code_.SetValue("CREATE_STRING", "CreateSharedString");
          }
          code_ +=
              "  auto {{FIELD_NAME}}__ = {{FIELD_NAME}} ? "
              "_fbb.{{CREATE_STRING}}({{FIELD_NAME}}) : 0;";
        } else if (IsVector(field->value.type)) {
          const std::string force_align_code =
              GenVectorForceAlign(*field, Name(*field) + "->size()");
          if (!force_align_code.empty()) {
            code_ += "  if ({{FIELD_NAME}}) { " + force_align_code + " }";
          }
          code_ += "  auto {{FIELD_NAME}}__ = {{FIELD_NAME}} ? \\";
          const auto vtype = field->value.type.VectorType();
          const auto has_key = TypeHasKey(vtype);
          if (IsStruct(vtype)) {
            const std::string type = WrapInNameSpace(*vtype.struct_def);
            if (has_key) {
              code_ += "_fbb.CreateVectorOfSortedStructs<" + type + ">\\";
            } else {
              // If the field uses 64-bit addressing, create a 64-bit vector.
              if (field->value.type.base_type == BASE_TYPE_VECTOR64) {
                code_ += "_fbb.CreateVectorOfStructs64\\";
              } else {
                code_ += "_fbb.CreateVectorOfStructs\\";
                if (field->offset64) {
                  // This is normal 32-bit vector, with 64-bit addressing.
                  code_ += "64<::flatbuffers::Vector>\\";
                } else {
                  code_ += "<" + type + ">\\";
                }
              }
            }
          } else if (has_key) {
            const auto type = WrapInNameSpace(*vtype.struct_def);
            code_ += "_fbb.CreateVectorOfSortedTables<" + type + ">\\";
          } else {
            const auto type = GenTypeWire(
                vtype, "", VectorElementUserFacing(vtype), field->offset64);

            if (field->value.type.base_type == BASE_TYPE_VECTOR64) {
              code_ += "_fbb.CreateVector64\\";
            } else {
              // If the field uses 64-bit addressing, create a 64-bit vector.
              code_.SetValue("64OFFSET", field->offset64 ? "64" : "");
              code_.SetValue("TYPE",
                             field->offset64 ? "::flatbuffers::Vector" : type);

              code_ += "_fbb.CreateVector{{64OFFSET}}<{{TYPE}}>\\";
            }
          }
          code_ += has_key ? "({{FIELD_NAME}}) : 0;" : "(*{{FIELD_NAME}}) : 0;";
        }
      });
      code_ += "  return {{CREATE_NAME}}{{STRUCT_NAME}}(";
      code_ += "      _fbb\\";
      for (const auto &field : struct_def.fields.vec) {
        if (field->deprecated) { continue; }
        code_.SetValue("FIELD_NAME", Name(*field));
        code_ += ",\n      {{FIELD_NAME}}\\";
        if (IsString(field->value.type) || IsVector(field->value.type)) {
          code_ += "__\\";
        }
      }
      code_ += ");";
      code_ += "}";
      code_ += "";
    }
  }